

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseExpr(ExpressionParser<__int128> *this)

{
  undefined8 uVar1;
  undefined1 val [16];
  undefined1 val_00 [16];
  undefined1 v2 [16];
  undefined1 v1 [16];
  __int128 _Var2;
  bool bVar3;
  int iVar4;
  __int128 *p_Var5;
  reference pvVar6;
  stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
  *this_00;
  __int128 *p_Var7;
  ExpressionParser<__int128> *extraout_RDX;
  ExpressionParser<__int128> *extraout_RDX_00;
  ExpressionParser<__int128> *extraout_RDX_01;
  long in_RDI;
  Operator op;
  __int128 value;
  value_type *in_stack_fffffffffffffe78;
  stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
  *in_stack_fffffffffffffe80;
  bool local_141;
  ExpressionParser<__int128> *in_stack_ffffffffffffff00;
  OperatorValue local_f8;
  __int128 *local_d8;
  __int128 *local_c8;
  ExpressionParser<__int128> *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Operator local_a8;
  undefined4 in_stack_ffffffffffffff68;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ExpressionParser<__int128> *pEVar12;
  __int128 *p_Var13;
  ExpressionParser<__int128> *local_70;
  ExpressionParser<__int128> *this_01;
  ExpressionParser<__int128> *in_stack_ffffffffffffffa8;
  OperatorValue local_48 [2];
  
  Operator::Operator((Operator *)&stack0xffffffffffffffac,0,0,0x4c);
  this_01 = (ExpressionParser<__int128> *)0x0;
  val._8_8_ = in_stack_fffffffffffffe80;
  val._0_8_ = in_stack_fffffffffffffe78;
  OperatorValue::OperatorValue(local_48,(Operator *)&stack0xffffffffffffffac,(__int128)val);
  std::
  stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
  ::push(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  p_Var5 = parseValue(in_stack_ffffffffffffffa8);
  pEVar12 = extraout_RDX;
  p_Var7 = p_Var5;
  local_70 = extraout_RDX;
  do {
    bVar3 = std::
            stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
            ::empty((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                     *)0x133576);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return (__int128 *)0x0;
    }
    local_a8 = parseOp(in_stack_ffffffffffffff00);
    iVar8 = local_a8.op;
    iVar9 = local_a8.precedence;
    iVar11 = local_a8.associativity;
    while( true ) {
      iVar10 = iVar9;
      pvVar6 = std::
               stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
               ::top((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                      *)0x1335d1);
      iVar4 = OperatorValue::getPrecedence(pvVar6);
      local_141 = true;
      bVar3 = iVar4 <= iVar9;
      iVar9 = iVar10;
      if (bVar3) {
        pvVar6 = std::
                 stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                 ::top((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                        *)0x133602);
        iVar4 = OperatorValue::getPrecedence(pvVar6);
        local_141 = iVar10 == iVar4 && iVar11 == 0x4c;
      }
      if (!local_141) break;
      pvVar6 = std::
               stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
               ::top((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                      *)0x13364c);
      bVar3 = OperatorValue::isNull(pvVar6);
      if (bVar3) {
        std::
        stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
        ::pop((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
               *)0x133668);
        return p_Var7;
      }
      pvVar6 = std::
               stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
               ::top((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
                      *)0x1336a0);
      _Var2 = pvVar6->value;
      uVar1 = *(undefined8 *)((long)&pvVar6->value + 8);
      p_Var13 = p_Var7;
      std::
      stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
      ::top((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
             *)0x1336d6);
      local_c0 = local_70;
      v1._8_8_ = p_Var13;
      v1._0_8_ = pEVar12;
      v2._4_4_ = iVar11;
      v2._0_4_ = iVar9;
      v2._8_8_ = p_Var5;
      local_c8 = p_Var7;
      local_b8 = (long)_Var2;
      local_b0 = uVar1;
      local_d8 = calculate(this_01,(__int128)v1,(__int128)v2,
                           (Operator *)CONCAT44(iVar8,in_stack_ffffffffffffff68));
      p_Var7 = local_d8;
      std::
      stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
      ::pop((stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
             *)0x133775);
      local_70 = extraout_RDX_00;
    }
    this_00 = (stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
               *)(in_RDI + 0x28);
    val_00._8_8_ = this_00;
    val_00._0_8_ = in_stack_fffffffffffffe78;
    OperatorValue::OperatorValue(&local_f8,(Operator *)&stack0xffffffffffffff6c,(__int128)val_00);
    std::
    stack<calculator::ExpressionParser<__int128>::OperatorValue,_std::deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>_>
    ::push(this_00,in_stack_fffffffffffffe78);
    p_Var7 = parseValue(in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffff00 = local_70;
    local_70 = extraout_RDX_01;
  } while( true );
}

Assistant:

T parseExpr()
  {
    stack_.push(OperatorValue(Operator(OPERATOR_NULL, 0, 'L'), 0));
    // first parse value on the left
    T value = parseValue();

    while (!stack_.empty())
    {
      // parse an operator (+, -, *, ...)
      Operator op(parseOp());
      while (op.precedence  < stack_.top().getPrecedence() || (
             op.precedence == stack_.top().getPrecedence() &&
             op.associativity == 'L'))
      {
        // end reached
        if (stack_.top().isNull())
        {
          stack_.pop();
          return value;
        }
        // do the calculation ("reduce"), producing a new value
        value = calculate(stack_.top().value, value, stack_.top().op);
        stack_.pop();
      }

      // store on stack_ and continue parsing ("shift")
      stack_.push(OperatorValue(op, value));
      // parse value on the right
      value = parseValue();
    }
    return 0;
  }